

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

size_t find_start_code(uint8_t *data,size_t size)

{
  uint uVar1;
  size_t i;
  uint32_t start_code;
  size_t size_local;
  uint8_t *data_local;
  
  start_code = 0xffffffff;
  i = 1;
  while( true ) {
    if (size <= i) {
      return 0;
    }
    uVar1 = start_code << 8;
    start_code = uVar1 | data[i];
    if (uVar1 == 0x100) break;
    i = i + 1;
  }
  return i - 3;
}

Assistant:

static size_t find_start_code(const uint8_t* data, size_t size)
{
    uint32_t start_code = 0xffffffff;
    for (size_t i = 1; i < size; ++i) {
        start_code = (start_code << 8) | data[i];
        if (0x00000100 == (start_code & 0xffffff00)) {
            return i - 3;
        }
    }
    return 0;
}